

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::ConditionalConstraint::fromSyntax
          (ConditionalConstraintSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Compilation *compilation;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  ConstraintItemSyntax *pCVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConditionalConstraint *ctrl;
  Constraint *pCVar6;
  socklen_t __len;
  socklen_t __len_00;
  Constraint *elseBody;
  ConstraintExprVisitor visitor;
  Constraint *local_40;
  ConstraintExprVisitor local_38;
  Expression *args;
  
  compilation = ASTContext::getCompilation(context);
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->condition);
  iVar2 = Expression::bind((int)pEVar4,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  pCVar5 = not_null<slang::syntax::ConstraintItemSyntax_*>::get(&syntax->constraints);
  iVar2 = Constraint::bind((int)pCVar5,(sockaddr *)context,__len);
  local_40 = (Constraint *)0x0;
  if (syntax->elseClause != (ElseConstraintClauseSyntax *)0x0) {
    pCVar5 = not_null<slang::syntax::ConstraintItemSyntax_*>::get(&syntax->elseClause->constraints);
    iVar3 = Constraint::bind((int)pCVar5,(sockaddr *)context,__len_00);
    local_40 = (Constraint *)CONCAT44(extraout_var_01,iVar3);
  }
  ctrl = BumpAllocator::
         emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
                   (&compilation->super_BumpAllocator,args,
                    (Constraint *)CONCAT44(extraout_var_00,iVar2),&local_40);
  bVar1 = Expression::bad(args);
  if (((!bVar1) && (((Constraint *)CONCAT44(extraout_var_00,iVar2))->kind != Invalid)) &&
     ((local_40 == (Constraint *)0x0 || (local_40->kind != Invalid)))) {
    local_38.failed = false;
    local_38.isSoft = false;
    local_38.context = context;
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>(args,&local_38);
    if (bVar1) {
      return &ctrl->super_Constraint;
    }
  }
  pCVar6 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar6;
}

Assistant:

Constraint& ConditionalConstraint::fromSyntax(const ConditionalConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.condition, context);
    auto& ifBody = Constraint::bind(*syntax.constraints, context);

    const Constraint* elseBody = nullptr;
    if (syntax.elseClause)
        elseBody = &Constraint::bind(*syntax.elseClause->constraints, context);

    auto result = comp.emplace<ConditionalConstraint>(pred, ifBody, elseBody);
    if (pred.bad() || ifBody.bad() || (elseBody && elseBody->bad()))
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}